

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  byte bVar2;
  ushort uVar3;
  lua_State *plVar4;
  TValue *pTVar5;
  BCIns *pBVar6;
  TraceError TVar7;
  TRef TVar8;
  CTypeID id;
  TRef TVar9;
  IRType IVar10;
  uint uVar11;
  GCcdata *cd;
  CTState *cts;
  cTValue *pcVar12;
  GCcdata GVar13;
  IRRef1 IVar14;
  BCIns *pBVar15;
  MMS mm;
  uint uVar16;
  TRef *pTVar17;
  CType *pCVar18;
  ulong uVar19;
  IRRef1 IVar20;
  CTState *cts_00;
  CType *pCVar21;
  TValue *pTVar22;
  MMS MVar23;
  ulong uVar24;
  ulong uVar25;
  BCReg BVar26;
  CType *pCVar27;
  bool bVar28;
  IRRef1 local_d0;
  cTValue local_c0;
  TRef local_b8;
  TRef local_b4 [33];
  
  cts_00 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  cd = argv2cdata(J,*J->base,rd->argv);
  uVar3 = cd->ctypeid;
  id = (CTypeID)uVar3;
  if (id == 0x15) {
    id = crec_constructor(J,cd,*J->base);
    mm = MM_new;
LAB_00152cd4:
    uVar11 = cts_00->tab[id].info;
    uVar16 = uVar11 & 0xffff;
    if ((uVar11 & 0xf0000000) != 0x20000000) {
      uVar16 = id;
    }
    pcVar12 = lj_ctype_meta(cts_00,uVar16,mm);
    if (pcVar12 == (cTValue *)0x0) {
      if (uVar3 == 0x15) {
        crec_alloc(J,rd,id);
        return;
      }
    }
    else if ((pcVar12->field_2).it == 0xfffffff7) {
      crec_tailcall(J,rd,pcVar12);
      return;
    }
    TVar7 = LJ_TRERR_BADTYPE;
LAB_00153248:
    lj_trace_err(J,TVar7);
  }
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar21 = cts->tab;
  uVar11 = pCVar21[uVar3].info;
  pCVar27 = pCVar21 + uVar3;
  mm = MM_call;
  MVar23 = mm;
  if ((uVar11 & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar27->size;
    uVar25 = (ulong)((uVar11 & 0xffff) << 4);
    uVar11 = *(uint *)((long)&pCVar21->info + uVar25);
    pCVar27 = (CType *)((long)&pCVar21->info + uVar25);
    MVar23 = (uint)(*pCVar1 == 8) * 4 + MM_FAST;
  }
  if ((uVar11 & 0xf0000000) != 0x60000000) goto LAB_00152cd4;
  TVar9 = *J->base;
  (J->fold).ins.field_0.ot = (short)MVar23 + 0x4400;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
  (J->fold).ins.field_0.op2 = 0xf;
  TVar9 = lj_opt_fold(J);
  local_d0 = (IRRef1)TVar9;
  pCVar21 = cts->tab + (ushort)pCVar27->info;
  IVar10 = crec_ct2irt(cts,pCVar21);
  if (MVar23 == MM_call) {
    GVar13 = cd[1];
  }
  else {
    GVar13.marked = '\0';
    GVar13.gct = '\0';
    GVar13.ctypeid = 0;
    GVar13.nextgc.gcptr32 = cd[1].nextgc.gcptr32;
  }
  local_c0.u64 = (ulong)GVar13 >> 2;
  pcVar12 = lj_tab_get(J->L,cts->miscmap,&local_c0);
  if ((pcVar12->field_2).it == 0xfffffffd) {
    TVar7 = LJ_TRERR_BLACKL;
LAB_00153267:
    lj_trace_err(J,TVar7);
  }
  uVar11 = pCVar21->info >> 0x1c;
  if (uVar11 == 4) {
    rd->nres = 0;
    IVar10 = IRT_NIL;
  }
  else if (((uVar11 != 2 && 0xfffffff < pCVar21->info) && (uVar11 != 5)) || (IVar10 == IRT_CDATA)) {
    TVar7 = LJ_TRERR_NYICALL;
    goto LAB_00153267;
  }
  if ((pCVar27->info & 0x800000) != 0) {
    TVar9 = lj_ir_kint(J,(int32_t)((ulong)((long)pCVar27 - (long)cts->tab) >> 4));
    (J->fold).ins.field_0.ot = 0x6200;
    (J->fold).ins.field_0.op1 = local_d0;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
    TVar9 = lj_opt_fold(J);
    local_d0 = (IRRef1)TVar9;
  }
  uVar3 = (ushort)IVar10;
  local_b8 = 0x7fff;
  pTVar17 = J->base;
  pTVar22 = rd->argv;
  uVar24 = 0;
  uVar25 = (ulong)pCVar27->sib;
  while (pTVar17[1] != 0) {
    if (uVar24 == 0x20) {
LAB_00153246:
      TVar7 = LJ_TRERR_NYICALL;
      goto LAB_00153248;
    }
    pTVar22 = pTVar22 + 1;
    if ((int)uVar25 == 0) {
      if ((pCVar27->info & 0x800000) == 0) goto LAB_00153246;
      uVar11 = lj_ccall_ctid_vararg(cts,pTVar22);
      pCVar18 = cts->tab;
      uVar19 = 0;
    }
    else {
      pCVar18 = cts->tab;
      uVar19 = (ulong)pCVar18[uVar25].sib;
      uVar11 = (uint)(ushort)pCVar18[uVar25].info;
    }
    pTVar17 = pTVar17 + 1;
    if (((0xfffffff < pCVar18[uVar11].info) && (uVar16 = pCVar18[uVar11].info >> 0x1c, uVar16 != 2))
       && (uVar16 != 5)) goto LAB_00153246;
    pCVar18 = pCVar18 + uVar11;
    TVar9 = crec_ct_tv(J,pCVar18,0,*pTVar17,pTVar22);
    uVar11 = pCVar18->info;
    if (((uVar11 & 0xf4000000) == 0) && (pCVar18->size < 4)) {
      bVar28 = pCVar18->size != 1;
      (J->fold).ins.field_0.ot = 0x5913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
      IVar14 = bVar28 + 0x270 + (ushort)bVar28;
      if ((uVar11 >> 0x17 & 1) == 0) {
        IVar14 = bVar28 + 0xa6f + (ushort)bVar28;
      }
      (J->fold).ins.field_0.op2 = IVar14;
      TVar9 = lj_opt_fold(J);
    }
    local_b4[uVar24 - 1] = TVar9;
    uVar24 = uVar24 + 1;
    uVar25 = uVar19;
  }
  TVar9 = local_b8;
  for (uVar25 = 1; uVar25 < (uVar24 & 0xffffffff); uVar25 = uVar25 + 1) {
    TVar8 = local_b4[uVar25 - 1];
    (J->fold).ins.field_0.ot = 0x6200;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
    TVar9 = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = uVar3 | 0x6100;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
  (J->fold).ins.field_0.op2 = local_d0;
  TVar9 = lj_opt_fold(J);
  IVar14 = (IRRef1)TVar9;
  if ((pCVar21->info & 0xf8000000) == 0x8000000) {
    plVar4 = J->L;
    pTVar22 = plVar4->base;
    uVar11 = *(uint *)((long)pTVar22 + -4);
    pBVar15 = (BCIns *)(ulong)uVar11;
    if (((uVar11 & 3) != 0) || (TVar9 = 0x7fff, *(char *)((long)pBVar15 - 1) != '\x01')) {
      if (((uVar11 & 3) != 0) || (J->framedepth < 1)) {
        lj_trace_err(J,LJ_TRERR_NYICALL);
      }
      pTVar5 = plVar4->top;
      pBVar6 = J->pc;
      pTVar17 = J->base;
      TVar9 = pTVar17[-1];
      J->pc = pBVar15;
      bVar2 = *(byte *)((long)pBVar15 - 3);
      plVar4->top = pTVar22;
      uVar25 = (ulong)((uint)bVar2 * 4 + 4);
      BVar26 = bVar2 + 1;
      plVar4->base = (TValue *)((long)pTVar22 - (ulong)((uint)bVar2 * 8 + 8));
      pTVar17[-1] = 0x1007ffe;
      J->base = (TRef *)((long)pTVar17 - uVar25);
      J->baseslot = J->baseslot - BVar26;
      J->maxslot = BVar26;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar4->base = pTVar22;
      plVar4->top = pTVar5;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar17 = J->base;
      J->base = (TRef *)((long)pTVar17 + uVar25);
      J->baseslot = J->baseslot + BVar26;
      *(TRef *)((long)pTVar17 + (uVar25 - 4)) = TVar9;
      J->pc = pBVar6;
      TVar9 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar14;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar9 = 0x2007ffd;
    }
    goto LAB_001531a4;
  }
  if (((IVar10 < IRT_SOFTFP) && ((0x600220U >> (IVar10 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar21->info & 0xf0000000) == 0x50000000)) {
    TVar9 = lj_ir_kint(J,(uint)(ushort)pCVar27->info);
    (J->fold).ins.field_0.ot = 0x528a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
    (J->fold).ins.field_0.op2 = IVar14;
  }
  else {
    switch(IVar10) {
    case IRT_FLOAT:
    case IRT_U32:
      IVar20 = uVar3 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x590e;
      goto LAB_00153214;
    default:
      if ((IVar10 & ~IRT_TRUE) != IRT_U8) goto LAB_001531a4;
      IVar20 = uVar3 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      IVar20 = uVar3 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5913;
LAB_00153214:
    (J->fold).ins.field_0.op1 = IVar14;
    (J->fold).ins.field_0.op2 = IVar20;
  }
  TVar9 = lj_opt_fold(J);
LAB_001531a4:
  *J->base = TVar9;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}